

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

void __thiscall QComboBoxListView::resizeEvent(QComboBoxListView *this,QResizeEvent *event)

{
  long lVar1;
  int iVar2;
  QSize this_00;
  QResizeEvent *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::viewport
            ((QAbstractScrollArea *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  iVar2 = QWidget::width((QWidget *)0x544727);
  this_00 = QListView::contentsSize
                      ((QListView *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  QSize::height((QSize *)0x544744);
  QListView::resizeContents
            ((QListView *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  QListView::resizeEvent((QListView *)this_00,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resizeEvent(QResizeEvent *event) override
    {
        resizeContents(viewport()->width(), contentsSize().height());
        QListView::resizeEvent(event);
    }